

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

ssize_t __thiscall
gmlc::networking::TcpConnection::send
          (TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  int count;
  size_t p;
  size_t sent_size;
  size_t sz;
  TcpConnection *in_stack_ffffffffffffff00;
  string *message;
  uint in_stack_ffffffffffffff0c;
  TcpConnection *in_stack_ffffffffffffff10;
  TcpConnection *this_00;
  milliseconds in_stack_ffffffffffffff18;
  allocator<char> local_d1;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int local_ac;
  long local_a8;
  void *local_a0;
  void *local_98;
  undefined1 local_89 [121];
  TcpConnection *local_10;
  void *local_8;
  
  local_89._113_8_ = CONCAT44(in_register_00000034,__fd);
  local_89._105_8_ = __buf;
  local_10 = this;
  bVar1 = isConnected(in_stack_ffffffffffffff00);
  if (!bVar1) {
    local_89._97_8_ = ms<(char)51,(char)48,(char)48>();
    bVar1 = waitUntilConnected(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    if (!bVar1) {
      in_stack_ffffffffffffff18.__r = (rep)(local_89 + 0x40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      logger(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(string *)in_stack_ffffffffffffff00
            );
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00);
      std::allocator<char>::~allocator((allocator<char> *)(local_89 + 0x40));
    }
    local_89._33_8_ = ms<(char)50,(char)48,(char)48>();
    bVar1 = waitUntilConnected(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    if (!bVar1) {
      this_00 = (TcpConnection *)local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      logger(this_00,in_stack_ffffffffffffff0c,(string *)in_stack_ffffffffffffff00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00);
      std::allocator<char>::~allocator((allocator<char> *)local_89);
      return 0;
    }
  }
  local_98 = (void *)0x0;
  local_a0 = (void *)local_89._105_8_;
  local_a8 = 0;
  local_ac = 0;
  while( true ) {
    in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c & 0xffffff;
    if (local_ac < 5) {
      peVar3 = std::
               __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x7d1e3c);
      iVar2 = (**peVar3->_vptr_Socket)(peVar3,local_89._113_8_ + local_a8,local_a0);
      local_98 = (void *)CONCAT44(extraout_var,iVar2);
      in_stack_ffffffffffffff0c = CONCAT13(local_98 != local_a0,(int3)in_stack_ffffffffffffff0c);
    }
    if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
    local_a0 = (void *)((long)local_a0 - (long)local_98);
    local_a8 = (long)local_98 + local_a8;
    local_ac = local_ac + 1;
  }
  if (local_ac + 1 < 5) {
    local_8 = (void *)local_89._105_8_;
  }
  else {
    message = (string *)&local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    logger(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,message);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
    std::allocator<char>::~allocator(&local_d1);
    local_8 = (void *)0x0;
  }
  return (ssize_t)local_8;
}

Assistant:

size_t TcpConnection::send(const void* buffer, size_t dataLength)
{
    if (!isConnected()) {
        if (!waitUntilConnected(300ms)) {
            logger(0, "connection timeout waiting again");
        }
        if (!waitUntilConnected(200ms)) {
            logger(0, "connection timeout twice, now returning");
            return 0;
        }
    }

    size_t sz{0};
    size_t sent_size{dataLength};
    size_t p{0};
    int count{0};
    while (count++ < 5 &&
           (sz = socket_->write_some(
                reinterpret_cast<const char*>(buffer) + p, sent_size)) !=
               sent_size) {
        sent_size -= sz;
        p += sz;
        //   std::cerr << "DEBUG partial buffer sent" << std::endl;
    }
    if (count >= 5) {
        logger(0, "TcpConnection send terminated");
        return 0;
    }
    return dataLength;

    //  assert(sz == dataLength);
    //  return sz;
}